

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

double __thiscall Logger::log(Logger *this,double __x)

{
  char in_AL;
  int iVar1;
  char *in_RDX;
  LogLevel in_ESI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  string message;
  va_list args;
  va_list args_copy;
  string local_148;
  undefined8 local_128;
  size_type *local_120;
  undefined1 *local_118;
  undefined8 local_108;
  size_type *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [48];
  double local_b8;
  
  if (in_AL != '\0') {
    local_b8 = __x;
  }
  if (this->running == true) {
    local_118 = local_e8;
    local_120 = &message._M_string_length;
    local_128 = 0x3000000018;
    local_108 = 0x3000000018;
    local_100 = local_120;
    local_f8 = local_118;
    iVar1 = vsnprintf((char *)0x0,0,in_RDX,&local_108);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_148,(char)(iVar1 + 1));
    vsnprintf(local_148._M_dataplus._M_p,(long)(iVar1 + 1),in_RDX,&local_128);
    addLogQueue(this,in_ESI,&local_148);
    __x = extraout_XMM0_Qa;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
      __x = extraout_XMM0_Qa_00;
    }
  }
  return __x;
}

Assistant:

inline void log(LogLevel level, const char* fmt, ...) 
    {
        if(!running) return;
        va_list args;
        va_start(args, fmt);
        std::string message = format(fmt, args);
        va_end(args);
        addLogQueue(level, message);
    }